

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void * multi_thread_kvs_client(void *args)

{
  fdb_kvs_handle **ptr_handle;
  void *pvVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t metalen;
  size_t bodylen;
  long lVar5;
  bool *__arg;
  char *__format;
  uint uVar6;
  fdb_doc *doc;
  ulong uVar7;
  pthread_t *__newthread;
  void *local_958 [20];
  pthread_t local_8b8 [17];
  undefined8 uStack_830;
  fdb_doc *apfStack_818 [51];
  undefined1 local_680 [8];
  fdb_config fconfig;
  char local_538 [8];
  char dbstr [256];
  char metabuf [256];
  char bodybuf [256];
  __suseconds_t _Stack_198;
  char keybuf [256];
  undefined1 local_90 [8];
  timeval __test_begin;
  fdb_kvs_handle *tdb;
  fdb_custom_cmp_variable local_70;
  undefined1 auStack_68 [8];
  fdb_kvs_config kvs_config;
  fdb_seqnum_t seqnum;
  fdb_doc *local_40;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  
  gettimeofday((timeval *)local_90,(__timezone_ptr_t)0x0);
  local_40 = (fdb_doc *)0x0;
  if (args == (void *)0x0) {
    memleak_start();
    system("rm -rf  dummy* > errorlog.txt");
    fdb_get_default_config();
    memcpy((fdb_config *)local_680,local_538,0xf8);
    fconfig.chunksize = 0;
    fconfig._2_2_ = 0;
    fconfig.blocksize = 0;
    fconfig.buffercache_size = 0x400;
    fconfig.flags._3_1_ = 0;
    fVar2 = fdb_open((fdb_file_handle **)&rdoc,"./dummy1",(fdb_config *)local_680);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x80a);
      multi_thread_kvs_client(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x80a,"void *multi_thread_kvs_client(void *)");
    }
    lVar5 = 0;
    uVar7 = 0;
    while (uVar7 != 0x14) {
      sprintf(local_538,"db%d",uVar7 & 0xffffffff);
      fdb_get_default_kvs_config();
      kvs_config.custom_cmp = (fdb_custom_cmp_variable)keybuf._8_8_;
      auStack_68 = (undefined1  [8])_Stack_198;
      kvs_config.create_if_missing = (bool)keybuf[0];
      kvs_config._1_1_ = keybuf[1];
      kvs_config._2_1_ = keybuf[2];
      kvs_config._3_1_ = keybuf[3];
      kvs_config._4_1_ = keybuf[4];
      kvs_config._5_1_ = keybuf[5];
      kvs_config._6_1_ = keybuf[6];
      kvs_config._7_1_ = keybuf[7];
      fVar2 = fdb_kvs_open((fdb_file_handle *)rdoc,(fdb_kvs_handle **)(bodybuf + lVar5 + 0xf8),
                           local_538,(fdb_kvs_config *)auStack_68);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x812);
        multi_thread_kvs_client(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x812,"void *multi_thread_kvs_client(void *)");
      }
      fVar2 = fdb_kvs_close(*(fdb_kvs_handle **)(bodybuf + uVar7 * 8 + 0xf8));
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 8;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x814);
        multi_thread_kvs_client(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x814,"void *multi_thread_kvs_client(void *)");
      }
    }
    __arg = (bool *)&fconfig.num_blocks_readahead;
    __newthread = local_8b8;
    for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 1) {
      *(uint32_t *)__arg = (uint32_t)lVar5;
      pthread_create(__newthread,(pthread_attr_t *)0x0,multi_thread_kvs_client,__arg);
      __newthread = __newthread + 1;
      __arg = __arg + 4;
    }
    for (lVar5 = 0; lVar5 != 0xa0; lVar5 = lVar5 + 8) {
      pthread_join(*(pthread_t *)((long)local_8b8 + lVar5),(void **)((long)local_958 + lVar5));
    }
    fVar2 = fdb_commit((fdb_file_handle *)rdoc,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x820);
      multi_thread_kvs_client(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x820,"void *multi_thread_kvs_client(void *)");
    }
    uVar7 = 0;
    while (uVar7 != 0x14) {
      sprintf(local_538,"db%d",uVar7 & 0xffffffff);
      fdb_get_default_kvs_config();
      kvs_config.custom_cmp = local_70;
      auStack_68 = (undefined1  [8])__test_begin.tv_usec;
      kvs_config._0_8_ = tdb;
      ptr_handle = (fdb_kvs_handle **)(bodybuf + uVar7 * 8 + 0xf8);
      fVar2 = fdb_kvs_open((fdb_file_handle *)rdoc,ptr_handle,local_538,(fdb_kvs_config *)auStack_68
                          );
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x827);
        multi_thread_kvs_client(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x827,"void *multi_thread_kvs_client(void *)");
      }
      fVar2 = fdb_get_kvs_seqnum(*ptr_handle,(fdb_seqnum_t *)&kvs_config.custom_cmp_param);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x82b);
        multi_thread_kvs_client(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x82b,"void *multi_thread_kvs_client(void *)");
      }
      if (kvs_config.custom_cmp_param != (void *)0x32) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
               );
        multi_thread_kvs_client(void*)::__test_pass = '\x01';
        if (kvs_config.custom_cmp_param != (void *)0x32) {
          __assert_fail("seqnum == (fdb_seqnum_t)n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x82c,"void *multi_thread_kvs_client(void *)");
        }
      }
      for (uVar6 = 0; uVar6 != 0x32; uVar6 = uVar6 + 1) {
        sprintf((char *)&_Stack_198,"key%d",(ulong)uVar6);
        sprintf(dbstr + 0xf8,"meta%d",(ulong)uVar6);
        sprintf(metabuf + 0xf8,"body%d",(ulong)uVar6);
        sVar4 = strlen((char *)&_Stack_198);
        fdb_doc_create(&local_40,&_Stack_198,sVar4,(void *)0x0,0,(void *)0x0,0);
        fVar2 = fdb_get(*ptr_handle,local_40);
        doc = local_40;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x835);
          multi_thread_kvs_client(void*)::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x835,"void *multi_thread_kvs_client(void *)");
        }
        pvVar1 = local_40->key;
        sVar4 = strlen((char *)&_Stack_198);
        iVar3 = bcmp(pvVar1,&_Stack_198,sVar4);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                 );
          doc = local_40;
          multi_thread_kvs_client(void*)::__test_pass = '\x01';
          pvVar1 = local_40->key;
          sVar4 = strlen((char *)&_Stack_198);
          iVar3 = bcmp(pvVar1,&_Stack_198,sVar4);
          if (iVar3 != 0) {
            __assert_fail("!memcmp(rdoc->key, keybuf, strlen(keybuf))",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x836,"void *multi_thread_kvs_client(void *)");
          }
        }
        iVar3 = bcmp(doc->meta,dbstr + 0xf8,doc->metalen);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                 );
          doc = local_40;
          multi_thread_kvs_client(void*)::__test_pass = '\x01';
          iVar3 = bcmp(local_40->meta,dbstr + 0xf8,local_40->metalen);
          if (iVar3 != 0) {
            __assert_fail("!memcmp(rdoc->meta, metabuf, rdoc->metalen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x837,"void *multi_thread_kvs_client(void *)");
          }
        }
        iVar3 = bcmp(doc->body,metabuf + 0xf8,doc->bodylen);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                 );
          doc = local_40;
          multi_thread_kvs_client(void*)::__test_pass = '\x01';
          iVar3 = bcmp(local_40->body,metabuf + 0xf8,local_40->bodylen);
          if (iVar3 != 0) {
            __assert_fail("!memcmp(rdoc->body, bodybuf, rdoc->bodylen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x838,"void *multi_thread_kvs_client(void *)");
          }
        }
        fdb_doc_free(doc);
      }
      fVar2 = fdb_kvs_close(*(fdb_kvs_handle **)(bodybuf + uVar7 * 8 + 0xf8));
      uVar7 = uVar7 + 1;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x83c);
        multi_thread_kvs_client(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x83c,"void *multi_thread_kvs_client(void *)");
      }
    }
    fVar2 = fdb_close((fdb_file_handle *)rdoc);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x840);
      multi_thread_kvs_client(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x840,"void *multi_thread_kvs_client(void *)");
    }
    fdb_shutdown();
    memleak_end();
    if (multi_thread_kvs_client(void*)::__test_pass == '\0') {
      __format = "%s PASSED\n";
    }
    else {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"multi thread kvs client");
  }
  else {
    fdb_get_default_config();
    memcpy((fdb_config *)local_680,local_538,0xf8);
    fVar2 = fdb_open((fdb_file_handle **)&rdoc,"./dummy1",(fdb_config *)local_680);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x84c);
      multi_thread_kvs_client(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x84c,"void *multi_thread_kvs_client(void *)");
    }
    sprintf(local_538,"db%d",(ulong)*args);
    fdb_get_default_kvs_config();
    kvs_config.custom_cmp = (fdb_custom_cmp_variable)keybuf._8_8_;
    auStack_68 = (undefined1  [8])_Stack_198;
    kvs_config.create_if_missing = (bool)keybuf[0];
    kvs_config._1_1_ = keybuf[1];
    kvs_config._2_1_ = keybuf[2];
    kvs_config._3_1_ = keybuf[3];
    kvs_config._4_1_ = keybuf[4];
    kvs_config._5_1_ = keybuf[5];
    kvs_config._6_1_ = keybuf[6];
    kvs_config._7_1_ = keybuf[7];
    fVar2 = fdb_kvs_open((fdb_file_handle *)rdoc,(fdb_kvs_handle **)&__test_begin.tv_usec,local_538,
                         (fdb_kvs_config *)auStack_68);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x853);
      multi_thread_kvs_client(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x853,"void *multi_thread_kvs_client(void *)");
    }
    lVar5 = 0;
    for (uVar7 = 0; uVar7 != 0x32; uVar7 = uVar7 + 1) {
      sprintf((char *)&_Stack_198,"key%d",uVar7 & 0xffffffff);
      sprintf(dbstr + 0xf8,"meta%d",uVar7 & 0xffffffff);
      sprintf(metabuf + 0xf8,"body%d",uVar7 & 0xffffffff);
      sVar4 = strlen((char *)&_Stack_198);
      metalen = strlen(dbstr + 0xf8);
      bodylen = strlen(metabuf + 0xf8);
      uStack_830 = 0x10ba57;
      fdb_doc_create((fdb_doc **)((long)apfStack_818 + lVar5),&_Stack_198,sVar4,dbstr + 0xf8,metalen
                     ,metabuf + 0xf8,bodylen);
      fVar2 = fdb_set((fdb_kvs_handle *)__test_begin.tv_usec,apfStack_818[uVar7]);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x85e);
        multi_thread_kvs_client(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x85e,"void *multi_thread_kvs_client(void *)");
      }
      fdb_doc_free(apfStack_818[uVar7]);
      lVar5 = lVar5 + 8;
    }
    fVar2 = fdb_commit((fdb_file_handle *)rdoc,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x862);
      multi_thread_kvs_client(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x862,"void *multi_thread_kvs_client(void *)");
    }
    fdb_close((fdb_file_handle *)rdoc);
  }
  return (void *)0x0;
}

Assistant:

void *multi_thread_kvs_client(void *args)
{

    TEST_INIT();

    int i, j, r;
    int n = 50;
    int nclients = 20;
    int *tid_args = alca(int, nclients);
    char dbstr[256];
    char keybuf[256], metabuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *tdb;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, nclients);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;

        // init dbfile
        fconfig = fdb_get_default_config();
        fconfig.buffercache_size = 0;
        fconfig.wal_threshold = 1024;
        fconfig.compaction_threshold = 0;

        status = fdb_open(&dbfile, "./dummy1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        for (i=0;i<nclients;++i){
            tid_args[i] = i;
            thread_create(&tid[i], multi_thread_kvs_client,
                          (void *)&tid_args[i]);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check threads updated kvs
        for (i=0; i<nclients; i++){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // verify seqnum
            status = fdb_get_kvs_seqnum(db[i], &seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(seqnum == (fdb_seqnum_t)n);

            for (j=0; j<n; j++){
                sprintf(keybuf, "key%d", j);
                sprintf(metabuf, "meta%d", j);
                sprintf(bodybuf, "body%d", j);
                fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                                      NULL, 0, NULL, 0);
                status = fdb_get(db[i], rdoc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
                TEST_CHK(!memcmp(rdoc->key, keybuf, strlen(keybuf)));
                TEST_CHK(!memcmp(rdoc->meta, metabuf, rdoc->metalen));
                TEST_CHK(!memcmp(rdoc->body, bodybuf, rdoc->bodylen));
                fdb_doc_free(rdoc);
            }
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_shutdown();
        memleak_end();
        TEST_RESULT("multi thread kvs client");
        return NULL;
    }

    // threads enter here //

    // open fhandle
    fconfig = fdb_get_default_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get kvs ID from args
    memcpy(&i, args, sizeof(int));
    sprintf(dbstr, "db%d", i);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open(dbfile, &tdb, dbstr, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(tdb, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    return NULL;
}